

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::FileStdio(FileStdio *this,Comm *comm)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"File",&local_51);
  std::__cxx11::string::string((string *)&local_50,"stdio",&local_52);
  Transport::Transport(&this->super_Transport,&local_30,&local_50,comm);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileStdio_00823298;
  this->m_File = (FILE *)0x0;
  this->m_IsOpening = false;
  (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_DelayedBufferSet = false;
  this->m_DelayedBuffer = (char *)0x0;
  this->m_DelayedBufferSize = 0;
  return;
}

Assistant:

FileStdio::FileStdio(helper::Comm const &comm) : Transport("File", "stdio", comm) {}